

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

int Gia_ManSimWriteFile(char *pFileOut,Vec_Int_t *vPat,int nOuts)

{
  int iVar1;
  FILE *__stream;
  FILE *pFile;
  int i;
  int c;
  int nOuts_local;
  Vec_Int_t *vPat_local;
  char *pFileOut_local;
  
  __stream = fopen(pFileOut,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file.\n");
    pFileOut_local._4_4_ = 0;
  }
  else {
    iVar1 = Vec_IntSize(vPat);
    if (iVar1 % nOuts != 0) {
      __assert_fail("Vec_IntSize(vPat) % nOuts == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                    ,0x2b5,"int Gia_ManSimWriteFile(char *, Vec_Int_t *, int)");
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_IntSize(vPat), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      iVar1 = Vec_IntEntry(vPat,pFile._4_4_);
      fputc(iVar1 + 0x30,__stream);
      if (pFile._4_4_ % nOuts == nOuts + -1) {
        fputc(10,__stream);
      }
    }
    fclose(__stream);
    pFileOut_local._4_4_ = 1;
  }
  return pFileOut_local._4_4_;
}

Assistant:

int Gia_ManSimWriteFile( char * pFileOut, Vec_Int_t * vPat, int nOuts )
{
    int c, i;
    FILE * pFile = fopen( pFileOut, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return 0;
    }
    assert( Vec_IntSize(vPat) % nOuts == 0 );
    Vec_IntForEachEntry( vPat, c, i )
    {
        fputc( '0' + c, pFile );
        if ( i % nOuts == nOuts - 1 )
            fputc( '\n', pFile );
    }
    fclose( pFile );
    return 1;
}